

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  BVH *bvh;
  NodeRef root;
  Scene *pSVar1;
  float *pfVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  size_t k;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  uint uVar30;
  undefined4 uVar31;
  int iVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  uint uVar39;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar40;
  NodeRef *pNVar41;
  bool bVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar59;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar55;
  float fVar57;
  float fVar58;
  undefined1 in_ZMM0 [64];
  undefined1 auVar56 [64];
  float fVar60;
  vint4 ai_2;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  vint4 bi;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  vint4 bi_1;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  vint4 bi_3;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar102;
  float fVar105;
  float fVar106;
  vint4 bi_2;
  undefined1 auVar103 [16];
  float fVar107;
  undefined1 auVar104 [16];
  float fVar108;
  float fVar109;
  float fVar117;
  float fVar119;
  vint4 ai;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar118;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar123;
  float fVar128;
  float fVar129;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar130;
  float fVar131;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar132;
  float fVar136;
  float fVar137;
  vint4 ai_1;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar138;
  undefined1 auVar135 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  vint4 ai_3;
  undefined1 auVar141 [16];
  float fVar142;
  float fVar144;
  uint uVar145;
  float fVar146;
  uint uVar147;
  float fVar148;
  uint uVar149;
  undefined1 auVar143 [64];
  uint uVar153;
  undefined1 auVar150 [16];
  uint uVar152;
  undefined1 in_ZMM12 [64];
  undefined1 auVar151 [64];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar156;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar163;
  float fVar167;
  float fVar168;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar169;
  Precalculations pre;
  undefined1 local_19c8 [8];
  float fStack_19c0;
  float fStack_19bc;
  undefined1 local_19b8 [16];
  RayK<4> *local_19a0;
  undefined1 local_1998 [16];
  undefined1 local_1988 [16];
  undefined1 local_1978 [8];
  float fStack_1970;
  float fStack_196c;
  vbool<4> terminated;
  undefined1 local_1948 [8];
  float fStack_1940;
  float fStack_193c;
  RTCFilterFunctionNArguments args;
  undefined1 local_18f8 [8];
  float fStack_18f0;
  float fStack_18ec;
  RTCHitN local_18a8 [16];
  undefined1 local_1898 [16];
  undefined1 local_1888 [16];
  undefined1 local_1878 [16];
  undefined1 local_1868 [16];
  undefined1 local_1858 [16];
  undefined1 local_1848 [16];
  uint local_1838;
  uint uStack_1834;
  uint uStack_1830;
  uint uStack_182c;
  uint uStack_1828;
  uint uStack_1824;
  uint uStack_1820;
  uint uStack_181c;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar29 = mm_lookupmask_ps._248_8_;
  uVar28 = mm_lookupmask_ps._240_8_;
  uVar27 = mm_lookupmask_ps._8_8_;
  uVar26 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar90 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar46 = vpcmpeqd_avx(auVar90,(undefined1  [16])valid_i->field_0);
    auVar53 = ZEXT816(0) << 0x40;
    auVar6 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar53,5);
    auVar97 = auVar46 & auVar6;
    if ((((auVar97 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar97 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar97 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar97[0xf] < '\0')
    {
      auVar6 = vandps_avx(auVar6,auVar46);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar139._8_4_ = 0x7fffffff;
      auVar139._0_8_ = 0x7fffffff7fffffff;
      auVar139._12_4_ = 0x7fffffff;
      auVar46 = vandps_avx(auVar139,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar124._8_4_ = 0x219392ef;
      auVar124._0_8_ = 0x219392ef219392ef;
      auVar124._12_4_ = 0x219392ef;
      auVar46 = vcmpps_avx(auVar46,auVar124,1);
      auVar97 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar124,auVar46)
      ;
      auVar46 = vandps_avx(auVar139,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar46 = vcmpps_avx(auVar46,auVar124,1);
      auVar54 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar124,auVar46)
      ;
      auVar46 = vandps_avx(auVar139,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar46 = vcmpps_avx(auVar46,auVar124,1);
      auVar46 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar124,auVar46)
      ;
      auVar98 = vrcpps_avx(auVar97);
      fVar57 = auVar98._0_4_;
      auVar91._0_4_ = auVar97._0_4_ * fVar57;
      fVar58 = auVar98._4_4_;
      auVar91._4_4_ = auVar97._4_4_ * fVar58;
      fVar59 = auVar98._8_4_;
      auVar91._8_4_ = auVar97._8_4_ * fVar59;
      fVar131 = auVar98._12_4_;
      auVar91._12_4_ = auVar97._12_4_ * fVar131;
      auVar125._8_4_ = 0x3f800000;
      auVar125._0_8_ = 0x3f8000003f800000;
      auVar125._12_4_ = 0x3f800000;
      auVar97 = vsubps_avx(auVar125,auVar91);
      tray.rdir.field_0._0_4_ = fVar57 + fVar57 * auVar97._0_4_;
      tray.rdir.field_0._4_4_ = fVar58 + fVar58 * auVar97._4_4_;
      tray.rdir.field_0._8_4_ = fVar59 + fVar59 * auVar97._8_4_;
      tray.rdir.field_0._12_4_ = fVar131 + fVar131 * auVar97._12_4_;
      auVar97 = vrcpps_avx(auVar54);
      fVar57 = auVar97._0_4_;
      auVar98._0_4_ = auVar54._0_4_ * fVar57;
      fVar58 = auVar97._4_4_;
      auVar98._4_4_ = auVar54._4_4_ * fVar58;
      fVar59 = auVar97._8_4_;
      auVar98._8_4_ = auVar54._8_4_ * fVar59;
      fVar131 = auVar97._12_4_;
      auVar98._12_4_ = auVar54._12_4_ * fVar131;
      auVar97 = vsubps_avx(auVar125,auVar98);
      tray.rdir.field_0._16_4_ = fVar57 + fVar57 * auVar97._0_4_;
      tray.rdir.field_0._20_4_ = fVar58 + fVar58 * auVar97._4_4_;
      tray.rdir.field_0._24_4_ = fVar59 + fVar59 * auVar97._8_4_;
      tray.rdir.field_0._28_4_ = fVar131 + fVar131 * auVar97._12_4_;
      auVar97 = vrcpps_avx(auVar46);
      fVar57 = auVar97._0_4_;
      auVar54._0_4_ = auVar46._0_4_ * fVar57;
      fVar58 = auVar97._4_4_;
      auVar54._4_4_ = auVar46._4_4_ * fVar58;
      fVar59 = auVar97._8_4_;
      auVar54._8_4_ = auVar46._8_4_ * fVar59;
      fVar131 = auVar97._12_4_;
      auVar54._12_4_ = auVar46._12_4_ * fVar131;
      auVar46 = vsubps_avx(auVar125,auVar54);
      tray.rdir.field_0._32_4_ = fVar57 + fVar57 * auVar46._0_4_;
      tray.rdir.field_0._36_4_ = fVar58 + fVar58 * auVar46._4_4_;
      tray.rdir.field_0._40_4_ = fVar59 + fVar59 * auVar46._8_4_;
      tray.rdir.field_0._44_4_ = fVar131 + fVar131 * auVar46._12_4_;
      auVar46 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar53,1);
      auVar110._8_4_ = 0x10;
      auVar110._0_8_ = 0x1000000010;
      auVar110._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar46,auVar110);
      auVar46 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar53,5);
      auVar97._8_4_ = 0x20;
      auVar97._0_8_ = 0x2000000020;
      auVar97._12_4_ = 0x20;
      auVar111._8_4_ = 0x30;
      auVar111._0_8_ = 0x3000000030;
      auVar111._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar111,auVar97,auVar46)
      ;
      auVar46 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar53,5);
      auVar103._8_4_ = 0x40;
      auVar103._0_8_ = 0x4000000040;
      auVar103._12_4_ = 0x40;
      auVar112._8_4_ = 0x50;
      auVar112._0_8_ = 0x5000000050;
      auVar112._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar112,auVar103,auVar46);
      auVar46 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar53);
      auVar97 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar53);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar143 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar46,auVar6);
      auVar46._8_4_ = 0xff800000;
      auVar46._0_8_ = 0xff800000ff800000;
      auVar46._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar46,auVar97,auVar6);
      terminated.field_0.i[1] = auVar6._4_4_ ^ auVar90._4_4_;
      terminated.field_0.i[0] = auVar6._0_4_ ^ auVar90._0_4_;
      terminated.field_0.i[2] = auVar6._8_4_ ^ auVar90._8_4_;
      terminated.field_0.i[3] = auVar6._12_4_ ^ auVar90._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar39 = 3;
      }
      else {
        uVar39 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_19a0 = ray + 0x80;
      pNVar41 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar40 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar90 = vpcmpeqd_avx(in_ZMM12._0_16_,in_ZMM12._0_16_);
      auVar151 = ZEXT1664(auVar90);
LAB_002fa06b:
      do {
        do {
          root.ptr = pNVar41[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_002fafa3;
          pNVar41 = pNVar41 + -1;
          paVar40 = paVar40 + -1;
          aVar67 = *paVar40;
          auVar90 = vcmpps_avx((undefined1  [16])aVar67,(undefined1  [16])tray.tfar.field_0,1);
          uVar30 = vmovmskps_avx(auVar90);
        } while (uVar30 == 0);
        uVar36 = (ulong)(uVar30 & 0xff);
        uVar30 = POPCOUNT(uVar30 & 0xff);
        if (uVar39 < uVar30) {
LAB_002fa0a9:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_002fafa3;
              auVar90 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar67,6);
              if ((((auVar90 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar90 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar90 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar90[0xf]) goto LAB_002fa06b;
              uVar36 = (ulong)((uint)root.ptr & 0xf);
              aVar55 = terminated.field_0;
              if (uVar36 == 8) goto LAB_002fae88;
              lVar34 = (root.ptr & 0xfffffffffffffff0) + 0x50;
              uVar33 = 0;
              auVar90 = auVar151._0_16_ ^ (undefined1  [16])terminated.field_0;
              goto LAB_002fa281;
            }
            lVar34 = 0;
            uVar36 = 8;
            aVar67 = auVar143._0_16_;
            do {
              uVar33 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar34 * 8);
              if (uVar33 == 8) break;
              uVar31 = *(undefined4 *)(root.ptr + 0x20 + lVar34 * 4);
              auVar61._4_4_ = uVar31;
              auVar61._0_4_ = uVar31;
              auVar61._8_4_ = uVar31;
              auVar61._12_4_ = uVar31;
              auVar53._8_8_ = tray.org.field_0._8_8_;
              auVar53._0_8_ = tray.org.field_0._0_8_;
              auVar20._8_8_ = tray.org.field_0._24_8_;
              auVar20._0_8_ = tray.org.field_0._16_8_;
              auVar21._8_8_ = tray.org.field_0._40_8_;
              auVar21._0_8_ = tray.org.field_0._32_8_;
              auVar90 = vsubps_avx(auVar61,auVar53);
              auVar113._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar90._0_4_;
              auVar113._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar90._4_4_;
              auVar113._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar90._8_4_;
              auVar113._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar90._12_4_;
              uVar31 = *(undefined4 *)(root.ptr + 0x40 + lVar34 * 4);
              auVar62._4_4_ = uVar31;
              auVar62._0_4_ = uVar31;
              auVar62._8_4_ = uVar31;
              auVar62._12_4_ = uVar31;
              auVar90 = vsubps_avx(auVar62,auVar20);
              auVar133._0_4_ = tray.rdir.field_0._16_4_ * auVar90._0_4_;
              auVar133._4_4_ = tray.rdir.field_0._20_4_ * auVar90._4_4_;
              auVar133._8_4_ = tray.rdir.field_0._24_4_ * auVar90._8_4_;
              auVar133._12_4_ = tray.rdir.field_0._28_4_ * auVar90._12_4_;
              uVar31 = *(undefined4 *)(root.ptr + 0x60 + lVar34 * 4);
              auVar63._4_4_ = uVar31;
              auVar63._0_4_ = uVar31;
              auVar63._8_4_ = uVar31;
              auVar63._12_4_ = uVar31;
              auVar90 = vsubps_avx(auVar63,auVar21);
              auVar141._0_4_ = tray.rdir.field_0._32_4_ * auVar90._0_4_;
              auVar141._4_4_ = tray.rdir.field_0._36_4_ * auVar90._4_4_;
              auVar141._8_4_ = tray.rdir.field_0._40_4_ * auVar90._8_4_;
              auVar141._12_4_ = tray.rdir.field_0._44_4_ * auVar90._12_4_;
              uVar31 = *(undefined4 *)(root.ptr + 0x30 + lVar34 * 4);
              auVar64._4_4_ = uVar31;
              auVar64._0_4_ = uVar31;
              auVar64._8_4_ = uVar31;
              auVar64._12_4_ = uVar31;
              auVar90 = vsubps_avx(auVar64,auVar53);
              auVar81._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar90._0_4_;
              auVar81._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar90._4_4_;
              auVar81._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar90._8_4_;
              auVar81._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar90._12_4_;
              uVar31 = *(undefined4 *)(root.ptr + 0x50 + lVar34 * 4);
              auVar65._4_4_ = uVar31;
              auVar65._0_4_ = uVar31;
              auVar65._8_4_ = uVar31;
              auVar65._12_4_ = uVar31;
              auVar90 = vsubps_avx(auVar65,auVar20);
              auVar92._0_4_ = tray.rdir.field_0._16_4_ * auVar90._0_4_;
              auVar92._4_4_ = tray.rdir.field_0._20_4_ * auVar90._4_4_;
              auVar92._8_4_ = tray.rdir.field_0._24_4_ * auVar90._8_4_;
              auVar92._12_4_ = tray.rdir.field_0._28_4_ * auVar90._12_4_;
              uVar31 = *(undefined4 *)(root.ptr + 0x70 + lVar34 * 4);
              auVar66._4_4_ = uVar31;
              auVar66._0_4_ = uVar31;
              auVar66._8_4_ = uVar31;
              auVar66._12_4_ = uVar31;
              auVar90 = vsubps_avx(auVar66,auVar21);
              auVar99._0_4_ = tray.rdir.field_0._32_4_ * auVar90._0_4_;
              auVar99._4_4_ = tray.rdir.field_0._36_4_ * auVar90._4_4_;
              auVar99._8_4_ = tray.rdir.field_0._40_4_ * auVar90._8_4_;
              auVar99._12_4_ = tray.rdir.field_0._44_4_ * auVar90._12_4_;
              auVar90 = vpminsd_avx(auVar113,auVar81);
              auVar46 = vpminsd_avx(auVar133,auVar92);
              auVar90 = vpmaxsd_avx(auVar90,auVar46);
              auVar46 = vpminsd_avx(auVar141,auVar99);
              auVar46 = vpmaxsd_avx(auVar90,auVar46);
              auVar90 = vpmaxsd_avx(auVar113,auVar81);
              auVar97 = vpmaxsd_avx(auVar133,auVar92);
              auVar97 = vpminsd_avx(auVar90,auVar97);
              auVar90 = vpmaxsd_avx(auVar141,auVar99);
              auVar97 = vpminsd_avx(auVar97,auVar90);
              auVar90 = vpmaxsd_avx(auVar46,(undefined1  [16])tray.tnear.field_0);
              auVar97 = vpminsd_avx(auVar97,(undefined1  [16])tray.tfar.field_0);
              auVar90 = vcmpps_avx(auVar90,auVar97,2);
              uVar35 = uVar36;
              aVar5 = aVar67;
              if (((((auVar90 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar90 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar90 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar90[0xf] < '\0') &&
                 (aVar5.v = (__m128)vblendvps_avx(auVar143._0_16_,auVar46,auVar90), uVar35 = uVar33,
                 uVar36 != 8)) {
                pNVar41->ptr = uVar36;
                pNVar41 = pNVar41 + 1;
                *paVar40 = aVar67;
                paVar40 = paVar40 + 1;
              }
              aVar67 = aVar5;
              uVar36 = uVar35;
              lVar34 = lVar34 + 1;
            } while (lVar34 != 4);
            if (uVar36 == 8) goto LAB_002fae73;
            auVar90 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar67,6);
            uVar31 = vmovmskps_avx(auVar90);
            root.ptr = uVar36;
          } while ((byte)uVar39 < (byte)POPCOUNT(uVar31));
          pNVar41->ptr = uVar36;
          pNVar41 = pNVar41 + 1;
          *paVar40 = aVar67;
          paVar40 = paVar40 + 1;
LAB_002fae73:
          iVar32 = 4;
        }
        else {
          do {
            k = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> k & 1) == 0; k = k + 1) {
              }
            }
            auVar151 = ZEXT1664(auVar151._0_16_);
            bVar42 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
            if (bVar42) {
              terminated.field_0.i[k] = -1;
            }
            uVar36 = uVar36 & uVar36 - 1;
          } while (uVar36 != 0);
          auVar90 = vpcmpeqd_avx(auVar151._0_16_,auVar151._0_16_);
          auVar151 = ZEXT1664(auVar90);
          auVar90 = auVar90 & ~(undefined1  [16])terminated.field_0;
          iVar32 = 3;
          if ((((auVar90 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar90 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar90 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar90[0xf] < '\0') {
            auVar90._8_4_ = 0xff800000;
            auVar90._0_8_ = 0xff800000ff800000;
            auVar90._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar90,
                               (undefined1  [16])terminated.field_0);
            iVar32 = 2;
          }
          auVar143 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if (uVar39 < uVar30) goto LAB_002fa0a9;
        }
      } while (iVar32 != 3);
LAB_002fafa3:
      auVar6 = vandps_avx(auVar6,(undefined1  [16])terminated.field_0);
      auVar80._8_4_ = 0xff800000;
      auVar80._0_8_ = 0xff800000ff800000;
      auVar80._12_4_ = 0xff800000;
      auVar6 = vmaskmovps_avx(auVar6,auVar80);
      *(undefined1 (*) [16])local_19a0 = auVar6;
    }
  }
  return;
  while( true ) {
    uVar33 = uVar33 + 1;
    lVar34 = lVar34 + 0x60;
    auVar90 = auVar97;
    if (uVar36 - 8 <= uVar33) break;
LAB_002fa281:
    pSVar1 = context->scene;
    auVar56 = ZEXT1664(auVar90);
    uVar35 = 0;
    while( true ) {
      auVar46 = auVar56._0_16_;
      uVar30 = *(uint *)(lVar34 + uVar35 * 4);
      if (uVar30 == 0xffffffff) break;
      uVar145 = *(uint *)(lVar34 + -0x10 + uVar35 * 4);
      pfVar2 = (pSVar1->vertices).items[uVar145];
      uVar38 = (ulong)*(uint *)(lVar34 + -0x50 + uVar35 * 4);
      uVar37 = (ulong)*(uint *)(lVar34 + -0x40 + uVar35 * 4);
      fVar57 = pfVar2[uVar38];
      auVar44._4_4_ = fVar57;
      auVar44._0_4_ = fVar57;
      auVar44._8_4_ = fVar57;
      auVar44._12_4_ = fVar57;
      fVar58 = pfVar2[uVar38 + 1];
      auVar68._4_4_ = fVar58;
      auVar68._0_4_ = fVar58;
      auVar68._8_4_ = fVar58;
      auVar68._12_4_ = fVar58;
      fVar59 = pfVar2[uVar38 + 2];
      auVar82._4_4_ = fVar59;
      auVar82._0_4_ = fVar59;
      auVar82._8_4_ = fVar59;
      auVar82._12_4_ = fVar59;
      local_1948._4_4_ = pfVar2[uVar37];
      local_19c8._4_4_ = pfVar2[uVar37 + 1];
      local_1978._4_4_ = pfVar2[uVar37 + 2];
      uVar37 = (ulong)*(uint *)(lVar34 + -0x20 + uVar35 * 4);
      local_18f8._4_4_ = pfVar2[uVar37];
      fVar131 = pfVar2[uVar37 + 1];
      fVar43 = pfVar2[uVar37 + 2];
      local_1948._0_4_ = local_1948._4_4_;
      fStack_1940 = (float)local_1948._4_4_;
      fStack_193c = (float)local_1948._4_4_;
      fVar156 = fVar57 - (float)local_1948._4_4_;
      local_19c8._0_4_ = local_19c8._4_4_;
      fStack_19c0 = (float)local_19c8._4_4_;
      fStack_19bc = (float)local_19c8._4_4_;
      fVar60 = fVar58 - (float)local_19c8._4_4_;
      local_1978._0_4_ = local_1978._4_4_;
      fStack_1970 = (float)local_1978._4_4_;
      fStack_196c = (float)local_1978._4_4_;
      fVar15 = fVar59 - (float)local_1978._4_4_;
      fVar58 = fVar131 - fVar58;
      fVar59 = fVar43 - fVar59;
      local_18f8._0_4_ = local_18f8._4_4_;
      fStack_18f0 = (float)local_18f8._4_4_;
      fStack_18ec = (float)local_18f8._4_4_;
      fVar57 = (float)local_18f8._4_4_ - fVar57;
      auVar97 = vsubps_avx(auVar44,*(undefined1 (*) [16])ray);
      auVar53 = vsubps_avx(auVar68,*(undefined1 (*) [16])(ray + 0x10));
      auVar54 = vsubps_avx(auVar82,*(undefined1 (*) [16])(ray + 0x20));
      fVar7 = *(float *)(ray + 0x50);
      fVar8 = *(float *)(ray + 0x54);
      fVar9 = *(float *)(ray + 0x58);
      fVar10 = *(float *)(ray + 0x5c);
      fVar11 = *(float *)(ray + 0x60);
      fVar12 = *(float *)(ray + 100);
      fVar13 = *(float *)(ray + 0x68);
      fVar14 = *(float *)(ray + 0x6c);
      fVar102 = auVar54._0_4_;
      auVar157._0_4_ = fVar102 * fVar7;
      fVar105 = auVar54._4_4_;
      auVar157._4_4_ = fVar105 * fVar8;
      fVar106 = auVar54._8_4_;
      auVar157._8_4_ = fVar106 * fVar9;
      fVar107 = auVar54._12_4_;
      auVar157._12_4_ = fVar107 * fVar10;
      fVar123 = auVar53._0_4_;
      auVar164._0_4_ = fVar123 * fVar11;
      fVar128 = auVar53._4_4_;
      auVar164._4_4_ = fVar128 * fVar12;
      fVar129 = auVar53._8_4_;
      auVar164._8_4_ = fVar129 * fVar13;
      fVar130 = auVar53._12_4_;
      auVar164._12_4_ = fVar130 * fVar14;
      auVar110 = vsubps_avx(auVar164,auVar157);
      fVar16 = *(float *)(ray + 0x40);
      fVar17 = *(float *)(ray + 0x44);
      fVar18 = *(float *)(ray + 0x48);
      fVar19 = *(float *)(ray + 0x4c);
      fVar108 = auVar97._0_4_;
      auVar158._0_4_ = fVar108 * fVar11;
      fVar117 = auVar97._4_4_;
      auVar158._4_4_ = fVar117 * fVar12;
      fVar119 = auVar97._8_4_;
      auVar158._8_4_ = fVar119 * fVar13;
      fVar121 = auVar97._12_4_;
      auVar158._12_4_ = fVar121 * fVar14;
      auVar165._0_4_ = fVar102 * fVar16;
      auVar165._4_4_ = fVar105 * fVar17;
      auVar165._8_4_ = fVar106 * fVar18;
      auVar165._12_4_ = fVar107 * fVar19;
      auVar111 = vsubps_avx(auVar165,auVar158);
      auVar166._0_4_ = fVar123 * fVar16;
      auVar166._4_4_ = fVar128 * fVar17;
      auVar166._8_4_ = fVar129 * fVar18;
      auVar166._12_4_ = fVar130 * fVar19;
      auVar159._0_4_ = fVar108 * fVar7;
      auVar159._4_4_ = fVar117 * fVar8;
      auVar159._8_4_ = fVar119 * fVar9;
      auVar159._12_4_ = fVar121 * fVar10;
      auVar112 = vsubps_avx(auVar159,auVar166);
      auVar97 = ZEXT416((uint)(fVar59 * fVar156 - fVar15 * fVar57));
      auVar54 = vshufps_avx(auVar97,auVar97,0);
      auVar97 = ZEXT416((uint)(fVar57 * fVar60 - fVar156 * fVar58));
      auVar98 = vshufps_avx(auVar97,auVar97,0);
      auVar124 = vpermilps_avx(ZEXT416((uint)(fVar15 * fVar58 - fVar59 * fVar60)),0);
      auVar93._0_4_ = auVar124._0_4_ * fVar16 + auVar54._0_4_ * fVar7 + auVar98._0_4_ * fVar11;
      auVar93._4_4_ = auVar124._4_4_ * fVar17 + auVar54._4_4_ * fVar8 + auVar98._4_4_ * fVar12;
      auVar93._8_4_ = auVar124._8_4_ * fVar18 + auVar54._8_4_ * fVar9 + auVar98._8_4_ * fVar13;
      auVar93._12_4_ = auVar124._12_4_ * fVar19 + auVar54._12_4_ * fVar10 + auVar98._12_4_ * fVar14;
      auVar53 = vshufps_avx(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58),0);
      auVar91 = vshufps_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59),0);
      auVar103 = vshufps_avx(ZEXT416((uint)fVar57),ZEXT416((uint)fVar57),0);
      uVar37 = (ulong)*(uint *)(lVar34 + -0x30 + uVar35 * 4);
      auVar69._8_4_ = 0x80000000;
      auVar69._0_8_ = 0x8000000080000000;
      auVar69._12_4_ = 0x80000000;
      auVar97 = vandps_avx(auVar93,auVar69);
      uVar147 = auVar97._0_4_;
      auVar134._0_4_ =
           (float)(uVar147 ^
                  (uint)(auVar110._0_4_ * auVar103._0_4_ +
                        auVar111._0_4_ * auVar53._0_4_ + auVar112._0_4_ * auVar91._0_4_));
      uVar149 = auVar97._4_4_;
      auVar134._4_4_ =
           (float)(uVar149 ^
                  (uint)(auVar110._4_4_ * auVar103._4_4_ +
                        auVar111._4_4_ * auVar53._4_4_ + auVar112._4_4_ * auVar91._4_4_));
      uVar152 = auVar97._8_4_;
      auVar134._8_4_ =
           (float)(uVar152 ^
                  (uint)(auVar110._8_4_ * auVar103._8_4_ +
                        auVar111._8_4_ * auVar53._8_4_ + auVar112._8_4_ * auVar91._8_4_));
      uVar153 = auVar97._12_4_;
      auVar134._12_4_ =
           (float)(uVar153 ^
                  (uint)(auVar110._12_4_ * auVar103._12_4_ +
                        auVar111._12_4_ * auVar53._12_4_ + auVar112._12_4_ * auVar91._12_4_));
      auVar53 = vcmpps_avx(auVar134,_DAT_01f7aa10,5);
      auVar91 = auVar46 & auVar53;
      fVar57 = pfVar2[uVar37];
      auVar160._4_4_ = fVar57;
      auVar160._0_4_ = fVar57;
      auVar160._8_4_ = fVar57;
      auVar160._12_4_ = fVar57;
      fVar57 = pfVar2[uVar37 + 1];
      auVar70._4_4_ = fVar57;
      auVar70._0_4_ = fVar57;
      auVar70._8_4_ = fVar57;
      auVar70._12_4_ = fVar57;
      fVar57 = pfVar2[uVar37 + 2];
      auVar94._4_4_ = fVar57;
      auVar94._0_4_ = fVar57;
      auVar94._8_4_ = fVar57;
      auVar94._12_4_ = fVar57;
      if ((((auVar91 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar91 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar91 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar91[0xf] < '\0'
         ) {
        auVar91 = vpermilps_avx(ZEXT416((uint)fVar156),0);
        auVar103 = vpermilps_avx(ZEXT416((uint)fVar60),0);
        auVar125 = vpermilps_avx(ZEXT416((uint)fVar15),0);
        auVar53 = vandps_avx(auVar53,auVar46);
        auVar114._0_4_ =
             (float)(uVar147 ^
                    (uint)(auVar91._0_4_ * auVar110._0_4_ +
                          auVar103._0_4_ * auVar111._0_4_ + auVar112._0_4_ * auVar125._0_4_));
        auVar114._4_4_ =
             (float)(uVar149 ^
                    (uint)(auVar91._4_4_ * auVar110._4_4_ +
                          auVar103._4_4_ * auVar111._4_4_ + auVar112._4_4_ * auVar125._4_4_));
        auVar114._8_4_ =
             (float)(uVar152 ^
                    (uint)(auVar91._8_4_ * auVar110._8_4_ +
                          auVar103._8_4_ * auVar111._8_4_ + auVar112._8_4_ * auVar125._8_4_));
        auVar114._12_4_ =
             (float)(uVar153 ^
                    (uint)(auVar91._12_4_ * auVar110._12_4_ +
                          auVar103._12_4_ * auVar111._12_4_ + auVar112._12_4_ * auVar125._12_4_));
        auVar91 = vcmpps_avx(auVar114,_DAT_01f7aa10,5);
        auVar103 = auVar53 & auVar91;
        local_1998 = auVar70;
        local_1988 = auVar160;
        if ((((auVar103 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar103 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar103 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar103[0xf] < '\0') {
          auVar47._8_4_ = 0x7fffffff;
          auVar47._0_8_ = 0x7fffffff7fffffff;
          auVar47._12_4_ = 0x7fffffff;
          auVar103 = vandps_avx(auVar93,auVar47);
          auVar53 = vandps_avx(auVar53,auVar91);
          auVar91 = vsubps_avx(auVar103,auVar134);
          auVar91 = vcmpps_avx(auVar91,auVar114,5);
          auVar110 = auVar53 & auVar91;
          if ((((auVar110 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar110 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar110 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar110[0xf] < '\0') {
            auVar53 = vandps_avx(auVar53,auVar91);
            auVar96._0_4_ =
                 (float)(uVar147 ^
                        (uint)(fVar108 * auVar124._0_4_ +
                              fVar123 * auVar54._0_4_ + auVar98._0_4_ * fVar102));
            auVar96._4_4_ =
                 (float)(uVar149 ^
                        (uint)(fVar117 * auVar124._4_4_ +
                              fVar128 * auVar54._4_4_ + auVar98._4_4_ * fVar105));
            auVar96._8_4_ =
                 (float)(uVar152 ^
                        (uint)(fVar119 * auVar124._8_4_ +
                              fVar129 * auVar54._8_4_ + auVar98._8_4_ * fVar106));
            auVar96._12_4_ =
                 (float)(uVar153 ^
                        (uint)(fVar121 * auVar124._12_4_ +
                              fVar130 * auVar54._12_4_ + auVar98._12_4_ * fVar107));
            fVar57 = auVar103._0_4_;
            auVar48._0_4_ = fVar57 * *(float *)(ray + 0x30);
            fVar58 = auVar103._4_4_;
            auVar48._4_4_ = fVar58 * *(float *)(ray + 0x34);
            fVar59 = auVar103._8_4_;
            auVar48._8_4_ = fVar59 * *(float *)(ray + 0x38);
            fVar156 = auVar103._12_4_;
            auVar48._12_4_ = fVar156 * *(float *)(ray + 0x3c);
            auVar91 = vcmpps_avx(auVar48,auVar96,1);
            auVar111 = *(undefined1 (*) [16])(ray + 0x80);
            auVar74._0_4_ = fVar57 * *(float *)(ray + 0x80);
            auVar74._4_4_ = fVar58 * *(float *)(ray + 0x84);
            auVar74._8_4_ = fVar59 * *(float *)(ray + 0x88);
            auVar74._12_4_ = fVar156 * *(float *)(ray + 0x8c);
            auVar110 = vcmpps_avx(auVar96,auVar74,2);
            auVar91 = vandps_avx(auVar110,auVar91);
            auVar110 = auVar53 & auVar91;
            if ((((auVar110 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar110 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar110 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar110[0xf] < '\0') {
              auVar53 = vandps_avx(auVar53,auVar91);
              auVar91 = vcmpps_avx(auVar93,_DAT_01f7aa10,4);
              auVar110 = auVar53 & auVar91;
              if ((((auVar110 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar110 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar110 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar110[0xf] < '\0') {
                auVar53 = vandps_avx(auVar91,auVar53);
                pGVar3 = (context->scene->geometries).items[uVar145].ptr;
                uVar147 = pGVar3->mask;
                auVar75._4_4_ = uVar147;
                auVar75._0_4_ = uVar147;
                auVar75._8_4_ = uVar147;
                auVar75._12_4_ = uVar147;
                auVar91 = vandps_avx(auVar75,*(undefined1 (*) [16])(ray + 0x90));
                auVar91 = vpcmpeqd_avx(auVar91,_DAT_01f7aa10);
                auVar110 = auVar53 & ~auVar91;
                if ((((auVar110 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar110 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar110 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar110[0xf] < '\0') {
                  auVar53 = vandnps_avx(auVar91,auVar53);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar91 = vrcpps_avx(auVar103);
                    fVar60 = auVar91._0_4_;
                    auVar126._0_4_ = fVar57 * fVar60;
                    fVar57 = auVar91._4_4_;
                    auVar126._4_4_ = fVar58 * fVar57;
                    fVar58 = auVar91._8_4_;
                    auVar126._8_4_ = fVar59 * fVar58;
                    fVar59 = auVar91._12_4_;
                    auVar126._12_4_ = fVar156 * fVar59;
                    auVar135._8_4_ = 0x3f800000;
                    auVar135._0_8_ = 0x3f8000003f800000;
                    auVar135._12_4_ = 0x3f800000;
                    auVar91 = vsubps_avx(auVar135,auVar126);
                    fVar60 = fVar60 + fVar60 * auVar91._0_4_;
                    fVar57 = fVar57 + fVar57 * auVar91._4_4_;
                    fVar58 = fVar58 + fVar58 * auVar91._8_4_;
                    fVar59 = fVar59 + fVar59 * auVar91._12_4_;
                    auVar101._0_4_ = fVar60 * auVar134._0_4_;
                    auVar101._4_4_ = fVar57 * auVar134._4_4_;
                    auVar101._8_4_ = fVar58 * auVar134._8_4_;
                    auVar101._12_4_ = fVar59 * auVar134._12_4_;
                    auVar91 = vminps_avx(auVar101,auVar135);
                    auVar116._0_4_ = fVar60 * auVar114._0_4_;
                    auVar116._4_4_ = fVar57 * auVar114._4_4_;
                    auVar116._8_4_ = fVar58 * auVar114._8_4_;
                    auVar116._12_4_ = fVar59 * auVar114._12_4_;
                    auVar103 = vminps_avx(auVar116,auVar135);
                    auVar110 = vsubps_avx(auVar135,auVar91);
                    auVar112 = vsubps_avx(auVar135,auVar103);
                    auVar23._8_8_ = uVar27;
                    auVar23._0_8_ = uVar26;
                    local_1878 = vblendvps_avx(auVar91,auVar110,auVar23);
                    local_1868 = vblendvps_avx(auVar103,auVar112,auVar23);
                    local_1848 = vpshufd_avx(ZEXT416(uVar145),0);
                    local_1858 = vpshufd_avx(ZEXT416(uVar30),0);
                    auVar77._0_4_ = fVar60 * auVar96._0_4_;
                    auVar77._4_4_ = fVar57 * auVar96._4_4_;
                    auVar77._8_4_ = fVar58 * auVar96._8_4_;
                    auVar77._12_4_ = fVar59 * auVar96._12_4_;
                    vcmpps_avx(ZEXT1632(auVar124),ZEXT1632(auVar124),0xf);
                    uStack_1834 = context->user->instID[0];
                    local_1838 = uStack_1834;
                    uStack_1830 = uStack_1834;
                    uStack_182c = uStack_1834;
                    uStack_1828 = context->user->instPrimID[0];
                    uStack_1824 = uStack_1828;
                    uStack_1820 = uStack_1828;
                    uStack_181c = uStack_1828;
                    auVar91 = vblendvps_avx(auVar111,auVar77,auVar53);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar91;
                    args.valid = (int *)local_19b8;
                    args.geometryUserPtr = pGVar3->userPtr;
                    args.context = context->user;
                    args.hit = local_18a8;
                    args.N = 4;
                    local_19b8 = auVar53;
                    args.ray = (RTCRayN *)ray;
                    local_18a8 = (RTCHitN  [16])auVar124;
                    local_1898 = auVar54;
                    local_1888 = auVar98;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar3->occlusionFilterN)(&args);
                    }
                    if (local_19b8 == (undefined1  [16])0x0) {
                      auVar53 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                      auVar53 = auVar53 ^ _DAT_01f7ae20;
                    }
                    else {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var4)(&args);
                      }
                      auVar54 = vpcmpeqd_avx(local_19b8,_DAT_01f7aa10);
                      auVar53 = auVar54 ^ _DAT_01f7ae20;
                      auVar86._8_4_ = 0xff800000;
                      auVar86._0_8_ = 0xff800000ff800000;
                      auVar86._12_4_ = 0xff800000;
                      auVar54 = vblendvps_avx(auVar86,*(undefined1 (*) [16])(args.ray + 0x80),
                                              auVar54);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar54;
                    }
                    auVar54 = vpslld_avx(auVar53,0x1f);
                    auVar53 = vpsrad_avx(auVar54,0x1f);
                    auVar54 = vblendvps_avx(auVar111,*(undefined1 (*) [16])local_19a0,auVar54);
                    *(undefined1 (*) [16])local_19a0 = auVar54;
                  }
                  auVar46 = vpandn_avx(auVar53,auVar46);
                  auVar70 = local_1998;
                  auVar160 = local_1988;
                }
              }
            }
          }
        }
      }
      if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar46 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar46 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar46[0xf])
      {
        auVar143 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar97 = vpcmpeqd_avx(auVar97,auVar97);
        auVar151 = ZEXT1664(auVar97);
        break;
      }
      auVar97 = vsubps_avx(auVar160,_local_18f8);
      auVar25._4_4_ = fVar131;
      auVar25._0_4_ = fVar131;
      auVar25._8_4_ = fVar131;
      auVar25._12_4_ = fVar131;
      auVar54 = vsubps_avx(auVar70,auVar25);
      auVar24._4_4_ = fVar43;
      auVar24._0_4_ = fVar43;
      auVar24._8_4_ = fVar43;
      auVar24._12_4_ = fVar43;
      auVar53 = vsubps_avx(auVar94,auVar24);
      auVar98 = vsubps_avx(_local_1948,auVar160);
      auVar91 = vsubps_avx(_local_19c8,auVar70);
      auVar103 = vsubps_avx(_local_1978,auVar94);
      fVar57 = auVar54._0_4_;
      fVar163 = auVar103._0_4_;
      auVar45._0_4_ = fVar163 * fVar57;
      fVar43 = auVar54._4_4_;
      fVar167 = auVar103._4_4_;
      auVar45._4_4_ = fVar167 * fVar43;
      fVar7 = auVar54._8_4_;
      fVar168 = auVar103._8_4_;
      auVar45._8_4_ = fVar168 * fVar7;
      fVar11 = auVar54._12_4_;
      fVar169 = auVar103._12_4_;
      auVar45._12_4_ = fVar169 * fVar11;
      fVar58 = auVar53._0_4_;
      fVar142 = auVar91._0_4_;
      auVar71._0_4_ = fVar142 * fVar58;
      fVar156 = auVar53._4_4_;
      fVar144 = auVar91._4_4_;
      auVar71._4_4_ = fVar144 * fVar156;
      fVar8 = auVar53._8_4_;
      fVar146 = auVar91._8_4_;
      auVar71._8_4_ = fVar146 * fVar8;
      fVar12 = auVar53._12_4_;
      fVar148 = auVar91._12_4_;
      auVar71._12_4_ = fVar148 * fVar12;
      auVar91 = vsubps_avx(auVar71,auVar45);
      fVar59 = auVar98._0_4_;
      auVar72._0_4_ = fVar58 * fVar59;
      fVar60 = auVar98._4_4_;
      auVar72._4_4_ = fVar156 * fVar60;
      fVar9 = auVar98._8_4_;
      auVar72._8_4_ = fVar8 * fVar9;
      fVar13 = auVar98._12_4_;
      auVar72._12_4_ = fVar12 * fVar13;
      fVar131 = auVar97._0_4_;
      auVar83._0_4_ = fVar163 * fVar131;
      fVar15 = auVar97._4_4_;
      auVar83._4_4_ = fVar167 * fVar15;
      fVar10 = auVar97._8_4_;
      auVar83._8_4_ = fVar168 * fVar10;
      fVar14 = auVar97._12_4_;
      auVar83._12_4_ = fVar169 * fVar14;
      auVar98 = vsubps_avx(auVar83,auVar72);
      auVar84._0_4_ = fVar142 * fVar131;
      auVar84._4_4_ = fVar144 * fVar15;
      auVar84._8_4_ = fVar146 * fVar10;
      auVar84._12_4_ = fVar148 * fVar14;
      auVar95._0_4_ = fVar59 * fVar57;
      auVar95._4_4_ = fVar60 * fVar43;
      auVar95._8_4_ = fVar9 * fVar7;
      auVar95._12_4_ = fVar13 * fVar11;
      auVar103 = vsubps_avx(auVar95,auVar84);
      auVar97 = vsubps_avx(auVar160,*(undefined1 (*) [16])ray);
      auVar53 = vsubps_avx(auVar70,*(undefined1 (*) [16])(ray + 0x10));
      auVar110 = vsubps_avx(auVar94,*(undefined1 (*) [16])(ray + 0x20));
      fVar16 = *(float *)(ray + 0x50);
      fVar17 = *(float *)(ray + 0x54);
      fVar18 = *(float *)(ray + 0x58);
      fVar19 = *(float *)(ray + 0x5c);
      fVar108 = *(float *)(ray + 0x60);
      fVar117 = *(float *)(ray + 100);
      fVar119 = *(float *)(ray + 0x68);
      fVar121 = *(float *)(ray + 0x6c);
      fVar132 = auVar110._0_4_;
      auVar150._0_4_ = fVar132 * fVar16;
      fVar136 = auVar110._4_4_;
      auVar150._4_4_ = fVar136 * fVar17;
      fVar137 = auVar110._8_4_;
      auVar150._8_4_ = fVar137 * fVar18;
      fVar138 = auVar110._12_4_;
      auVar150._12_4_ = fVar138 * fVar19;
      fVar109 = auVar53._0_4_;
      auVar154._0_4_ = fVar109 * fVar108;
      fVar118 = auVar53._4_4_;
      auVar154._4_4_ = fVar118 * fVar117;
      fVar120 = auVar53._8_4_;
      auVar154._8_4_ = fVar120 * fVar119;
      fVar122 = auVar53._12_4_;
      auVar154._12_4_ = fVar122 * fVar121;
      auVar53 = vsubps_avx(auVar154,auVar150);
      fVar123 = *(float *)(ray + 0x40);
      fVar128 = *(float *)(ray + 0x44);
      fVar129 = *(float *)(ray + 0x48);
      fVar130 = *(float *)(ray + 0x4c);
      fVar102 = auVar97._0_4_;
      auVar155._0_4_ = fVar102 * fVar108;
      fVar105 = auVar97._4_4_;
      auVar155._4_4_ = fVar105 * fVar117;
      fVar106 = auVar97._8_4_;
      auVar155._8_4_ = fVar106 * fVar119;
      fVar107 = auVar97._12_4_;
      auVar155._12_4_ = fVar107 * fVar121;
      auVar161._0_4_ = fVar132 * fVar123;
      auVar161._4_4_ = fVar136 * fVar128;
      auVar161._8_4_ = fVar137 * fVar129;
      auVar161._12_4_ = fVar138 * fVar130;
      auVar110 = vsubps_avx(auVar161,auVar155);
      auVar162._0_4_ = fVar109 * fVar123;
      auVar162._4_4_ = fVar118 * fVar128;
      auVar162._8_4_ = fVar120 * fVar129;
      auVar162._12_4_ = fVar122 * fVar130;
      auVar85._0_4_ = fVar16 * fVar102;
      auVar85._4_4_ = fVar17 * fVar105;
      auVar85._8_4_ = fVar18 * fVar106;
      auVar85._12_4_ = fVar19 * fVar107;
      auVar111 = vsubps_avx(auVar85,auVar162);
      auVar140._0_4_ = auVar91._0_4_ * fVar123 + fVar16 * auVar98._0_4_ + auVar103._0_4_ * fVar108;
      auVar140._4_4_ = auVar91._4_4_ * fVar128 + fVar17 * auVar98._4_4_ + auVar103._4_4_ * fVar117;
      auVar140._8_4_ = auVar91._8_4_ * fVar129 + fVar18 * auVar98._8_4_ + auVar103._8_4_ * fVar119;
      auVar140._12_4_ =
           auVar91._12_4_ * fVar130 + fVar19 * auVar98._12_4_ + auVar103._12_4_ * fVar121;
      auVar73._8_4_ = 0x80000000;
      auVar73._0_8_ = 0x8000000080000000;
      auVar73._12_4_ = 0x80000000;
      auVar97 = vandps_avx(auVar140,auVar73);
      uVar30 = auVar97._0_4_;
      auVar100._0_4_ =
           (float)(uVar30 ^ (uint)(auVar53._0_4_ * fVar59 +
                                  fVar142 * auVar110._0_4_ + fVar163 * auVar111._0_4_));
      uVar145 = auVar97._4_4_;
      auVar100._4_4_ =
           (float)(uVar145 ^
                  (uint)(auVar53._4_4_ * fVar60 +
                        fVar144 * auVar110._4_4_ + fVar167 * auVar111._4_4_));
      uVar147 = auVar97._8_4_;
      auVar100._8_4_ =
           (float)(uVar147 ^
                  (uint)(auVar53._8_4_ * fVar9 + fVar146 * auVar110._8_4_ + fVar168 * auVar111._8_4_
                        ));
      uVar149 = auVar97._12_4_;
      auVar100._12_4_ =
           (float)(uVar149 ^
                  (uint)(auVar53._12_4_ * fVar13 +
                        fVar148 * auVar110._12_4_ + fVar169 * auVar111._12_4_));
      auVar56 = ZEXT1664(auVar46);
      auVar97 = vcmpps_avx(auVar100,_DAT_01f7aa10,5);
      auVar112 = auVar46 & auVar97;
      _local_1978 = auVar54;
      if ((((auVar112 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar112 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar112 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          auVar112[0xf] < '\0') {
        auVar97 = vandps_avx(auVar97,auVar46);
        auVar104._0_4_ =
             (float)(uVar30 ^ (uint)(auVar53._0_4_ * fVar131 +
                                    auVar110._0_4_ * fVar57 + fVar58 * auVar111._0_4_));
        auVar104._4_4_ =
             (float)(uVar145 ^
                    (uint)(auVar53._4_4_ * fVar15 +
                          auVar110._4_4_ * fVar43 + fVar156 * auVar111._4_4_));
        auVar104._8_4_ =
             (float)(uVar147 ^
                    (uint)(auVar53._8_4_ * fVar10 + auVar110._8_4_ * fVar7 + fVar8 * auVar111._8_4_)
                    );
        auVar104._12_4_ =
             (float)(uVar149 ^
                    (uint)(auVar53._12_4_ * fVar14 +
                          auVar110._12_4_ * fVar11 + fVar12 * auVar111._12_4_));
        auVar54 = vcmpps_avx(auVar104,_DAT_01f7aa10,5);
        auVar110 = auVar97 & auVar54;
        if ((((auVar110 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar110 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar110 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar110[0xf] < '\0') {
          auVar49._8_4_ = 0x7fffffff;
          auVar49._0_8_ = 0x7fffffff7fffffff;
          auVar49._12_4_ = 0x7fffffff;
          auVar110 = vandps_avx(auVar140,auVar49);
          auVar97 = vandps_avx(auVar54,auVar97);
          auVar53 = vsubps_avx(auVar110,auVar100);
          auVar53 = vcmpps_avx(auVar53,auVar104,5);
          auVar54 = auVar97 & auVar53;
          if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar54[0xf] < '\0') {
            auVar97 = vandps_avx(auVar53,auVar97);
            auVar115._0_4_ =
                 (float)(uVar30 ^ (uint)(auVar91._0_4_ * fVar102 +
                                        fVar109 * auVar98._0_4_ + fVar132 * auVar103._0_4_));
            auVar115._4_4_ =
                 (float)(uVar145 ^
                        (uint)(auVar91._4_4_ * fVar105 +
                              fVar118 * auVar98._4_4_ + fVar136 * auVar103._4_4_));
            auVar115._8_4_ =
                 (float)(uVar147 ^
                        (uint)(auVar91._8_4_ * fVar106 +
                              fVar120 * auVar98._8_4_ + fVar137 * auVar103._8_4_));
            auVar115._12_4_ =
                 (float)(uVar149 ^
                        (uint)(auVar91._12_4_ * fVar107 +
                              fVar122 * auVar98._12_4_ + fVar138 * auVar103._12_4_));
            fVar57 = auVar110._0_4_;
            auVar50._0_4_ = fVar57 * *(float *)(ray + 0x30);
            fVar58 = auVar110._4_4_;
            auVar50._4_4_ = fVar58 * *(float *)(ray + 0x34);
            fVar59 = auVar110._8_4_;
            auVar50._8_4_ = fVar59 * *(float *)(ray + 0x38);
            fVar131 = auVar110._12_4_;
            auVar50._12_4_ = fVar131 * *(float *)(ray + 0x3c);
            auVar54 = vcmpps_avx(auVar50,auVar115,1);
            _local_1978 = *(undefined1 (*) [16])(ray + 0x80);
            auVar76._0_4_ = fVar57 * *(float *)(ray + 0x80);
            auVar76._4_4_ = fVar58 * *(float *)(ray + 0x84);
            auVar76._8_4_ = fVar59 * *(float *)(ray + 0x88);
            auVar76._12_4_ = fVar131 * *(float *)(ray + 0x8c);
            auVar111 = vcmpps_avx(auVar115,auVar76,2);
            auVar54 = vandps_avx(auVar111,auVar54);
            auVar111 = auVar97 & auVar54;
            if ((((auVar111 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar111 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar111 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar111[0xf] < '\0') {
              auVar97 = vandps_avx(auVar97,auVar54);
              auVar54 = vcmpps_avx(auVar140,_DAT_01f7aa10,4);
              auVar111 = auVar97 & auVar54;
              if ((((auVar111 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar111 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar111 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar111[0xf] < '\0') {
                auVar97 = vandps_avx(auVar54,auVar97);
                uVar145 = *(uint *)(lVar34 + -0x10 + uVar35 * 4);
                pGVar3 = (context->scene->geometries).items[uVar145].ptr;
                uVar30 = pGVar3->mask;
                auVar51._4_4_ = uVar30;
                auVar51._0_4_ = uVar30;
                auVar51._8_4_ = uVar30;
                auVar51._12_4_ = uVar30;
                auVar54 = vandps_avx(auVar51,*(undefined1 (*) [16])(ray + 0x90));
                auVar54 = vpcmpeqd_avx(auVar54,_DAT_01f7aa10);
                auVar111 = auVar97 & ~auVar54;
                if ((((auVar111 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar111 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar111 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar111[0xf] < '\0') {
                  auVar97 = vandnps_avx(auVar54,auVar97);
                  auVar53 = auVar91;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar54 = vrcpps_avx(auVar110);
                    fVar43 = auVar54._0_4_;
                    auVar78._0_4_ = fVar57 * fVar43;
                    fVar57 = auVar54._4_4_;
                    auVar78._4_4_ = fVar58 * fVar57;
                    fVar58 = auVar54._8_4_;
                    auVar78._8_4_ = fVar59 * fVar58;
                    fVar59 = auVar54._12_4_;
                    auVar78._12_4_ = fVar131 * fVar59;
                    auVar127._8_4_ = 0x3f800000;
                    auVar127._0_8_ = 0x3f8000003f800000;
                    auVar127._12_4_ = 0x3f800000;
                    auVar54 = vsubps_avx(auVar127,auVar78);
                    fVar43 = fVar43 + fVar43 * auVar54._0_4_;
                    fVar57 = fVar57 + fVar57 * auVar54._4_4_;
                    fVar58 = fVar58 + fVar58 * auVar54._8_4_;
                    fVar59 = fVar59 + fVar59 * auVar54._12_4_;
                    auVar79._0_4_ = fVar43 * auVar100._0_4_;
                    auVar79._4_4_ = fVar57 * auVar100._4_4_;
                    auVar79._8_4_ = fVar58 * auVar100._8_4_;
                    auVar79._12_4_ = fVar59 * auVar100._12_4_;
                    auVar54 = vminps_avx(auVar79,auVar127);
                    auVar87._0_4_ = fVar43 * auVar104._0_4_;
                    auVar87._4_4_ = fVar57 * auVar104._4_4_;
                    auVar87._8_4_ = fVar58 * auVar104._8_4_;
                    auVar87._12_4_ = fVar59 * auVar104._12_4_;
                    auVar110 = vminps_avx(auVar87,auVar127);
                    auVar111 = vsubps_avx(auVar127,auVar54);
                    auVar112 = vsubps_avx(auVar127,auVar110);
                    auVar22._8_8_ = uVar29;
                    auVar22._0_8_ = uVar28;
                    local_1878 = vblendvps_avx(auVar54,auVar111,auVar22);
                    local_1868 = vblendvps_avx(auVar110,auVar112,auVar22);
                    local_1848 = vpshufd_avx(ZEXT416(uVar145),0);
                    local_1858 = vpshufd_avx(ZEXT416(*(uint *)(lVar34 + uVar35 * 4)),0);
                    auVar52._0_4_ = fVar43 * auVar115._0_4_;
                    auVar52._4_4_ = fVar57 * auVar115._4_4_;
                    auVar52._8_4_ = fVar58 * auVar115._8_4_;
                    auVar52._12_4_ = fVar59 * auVar115._12_4_;
                    vcmpps_avx(ZEXT1632(local_1878),ZEXT1632(local_1878),0xf);
                    uStack_1834 = context->user->instID[0];
                    local_1838 = uStack_1834;
                    uStack_1830 = uStack_1834;
                    uStack_182c = uStack_1834;
                    uStack_1828 = context->user->instPrimID[0];
                    uStack_1824 = uStack_1828;
                    uStack_1820 = uStack_1828;
                    uStack_181c = uStack_1828;
                    auVar54 = vblendvps_avx(_local_1978,auVar52,auVar97);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar54;
                    args.valid = (int *)local_19b8;
                    args.geometryUserPtr = pGVar3->userPtr;
                    args.context = context->user;
                    args.hit = local_18a8;
                    args.N = 4;
                    local_19b8 = auVar97;
                    args.ray = (RTCRayN *)ray;
                    local_18a8 = (RTCHitN  [16])auVar91;
                    local_1898 = auVar98;
                    local_1888 = auVar103;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar3->occlusionFilterN)(&args);
                    }
                    if (local_19b8 == (undefined1  [16])0x0) {
                      auVar97 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                      auVar97 = auVar97 ^ _DAT_01f7ae20;
                    }
                    else {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var4)(&args);
                      }
                      auVar54 = vpcmpeqd_avx(local_19b8,_DAT_01f7aa10);
                      auVar97 = auVar54 ^ _DAT_01f7ae20;
                      auVar88._8_4_ = 0xff800000;
                      auVar88._0_8_ = 0xff800000ff800000;
                      auVar88._12_4_ = 0xff800000;
                      auVar54 = vblendvps_avx(auVar88,*(undefined1 (*) [16])(args.ray + 0x80),
                                              auVar54);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar54;
                    }
                    auVar54 = vpslld_avx(auVar97,0x1f);
                    auVar97 = vpsrad_avx(auVar54,0x1f);
                    auVar54 = vblendvps_avx(_local_1978,*(undefined1 (*) [16])local_19a0,auVar54);
                    *(undefined1 (*) [16])local_19a0 = auVar54;
                  }
                  auVar46 = vpandn_avx(auVar97,auVar46);
                  auVar56 = ZEXT1664(auVar46);
                  goto LAB_002fa5ec;
                }
              }
            }
          }
        }
        auVar56 = ZEXT1664(auVar46);
      }
LAB_002fa5ec:
      auVar46 = auVar56._0_16_;
      auVar143 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar97 = vpcmpeqd_avx(auVar53,auVar53);
      auVar151 = ZEXT1664(auVar97);
      if (((((auVar46 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar46 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar46 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar56[0xf])
         || (bVar42 = 2 < uVar35, uVar35 = uVar35 + 1, bVar42)) break;
    }
    auVar97 = vpand_avx(auVar46,auVar90);
    auVar90 = auVar90 & auVar46;
    if ((((auVar90 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar90 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar90 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar90[0xf])
    break;
  }
  aVar55 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar151._0_16_ ^ auVar97);
LAB_002fae88:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vpor_avx((undefined1  [16])terminated.field_0,(undefined1  [16])aVar55);
  auVar90 = auVar151._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar90 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar90 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar90 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar90[0xf])
  goto LAB_002fafa3;
  auVar89._8_4_ = 0xff800000;
  auVar89._0_8_ = 0xff800000ff800000;
  auVar89._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar89,
                     (undefined1  [16])terminated.field_0);
  goto LAB_002fa06b;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }